

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

Var Js::JavascriptRegExp::CallExec
              (RecyclableObject *thisObj,JavascriptString *string,PCWSTR varName,
              ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  bool bVar2;
  Attributes attributes;
  BOOL BVar3;
  Var pvVar4;
  RecyclableObject *pRVar5;
  JavascriptRegExp *regularExpression;
  anon_class_32_4_07ff6b3c local_60;
  PCWSTR local_40;
  bool local_31;
  
  pvVar4 = JavascriptOperators::GetProperty(thisObj,0x83,scriptContext,(PropertyValueInfo *)0x0);
  bVar2 = JavascriptConversion::IsCallable(pvVar4);
  if (!bVar2) {
    regularExpression = ToRegExp(thisObj,varName,scriptContext);
    pvVar4 = RegexHelper::RegexExec(scriptContext,regularExpression,string,false,(void *)0x0);
    return pvVar4;
  }
  local_40 = varName;
  pRVar5 = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
  this = scriptContext->threadContext;
  local_31 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_60.scriptContext = scriptContext;
  local_60.execFn = pRVar5;
  local_60.thisObj = thisObj;
  local_60.string = string;
  attributes = FunctionInfo::GetAttributes(pRVar5);
  bVar2 = ThreadContext::HasNoSideEffect(this,pRVar5,attributes);
  if (bVar2) {
    pRVar5 = (RecyclableObject *)CallExec::anon_class_32_4_07ff6b3c::operator()(&local_60);
    bVar2 = ThreadContext::IsOnStack(pRVar5);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar5 = (((((((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00bb1ac1;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      pRVar5 = (RecyclableObject *)CallExec::anon_class_32_4_07ff6b3c::operator()(&local_60);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00bb1ac1;
    }
    pRVar5 = (RecyclableObject *)CallExec::anon_class_32_4_07ff6b3c::operator()(&local_60);
    bVar2 = ThreadContext::IsOnStack(pRVar5);
  }
  if (bVar2 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00bb1ac1:
  this->reentrancySafeOrHandled = local_31;
  BVar3 = JavascriptOperators::IsObjectOrNull(pRVar5);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9f7,local_40);
  }
  return pRVar5;
}

Assistant:

Var JavascriptRegExp::CallExec(RecyclableObject* thisObj, JavascriptString* string, PCWSTR varName, ScriptContext* scriptContext)
    {
        Var exec = JavascriptOperators::GetProperty(thisObj, PropertyIds::exec, scriptContext);
        if (JavascriptConversion::IsCallable(exec))
        {
            RecyclableObject* execFn = UnsafeVarTo<RecyclableObject>(exec);
            ThreadContext * threadContext = scriptContext->GetThreadContext();
            Var result = threadContext->ExecuteImplicitCall(execFn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                return CALL_FUNCTION(scriptContext->GetThreadContext(), execFn, CallInfo(CallFlags_Value, 2), thisObj, string);
            });

            if (!JavascriptOperators::IsObjectOrNull(result))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_RegExpExecInvalidReturnType, varName);
            }

            return result;
        }

        JavascriptRegExp* regExObj = ToRegExp(thisObj, varName, scriptContext);
        return RegexHelper::RegexExec(scriptContext, regExObj, string, false);
    }